

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O0

void __thiscall ThreadedReplayer::flush_pipeline_cache(ThreadedReplayer *this)

{
  VkPipelineCache pVVar1;
  PFN_vkDestroyPipelineCache p_Var2;
  PFN_vkGetPipelineCacheData p_Var3;
  pointer __n;
  bool bVar4;
  VkResult VVar5;
  ulong uVar6;
  pointer pVVar7;
  VkDevice pVVar8;
  uchar *puVar9;
  char *__filename;
  FILE *__s;
  size_type sVar10;
  size_t sVar11;
  FILE *file;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pipeline_buffer;
  size_t pipeline_cache_size;
  ThreadedReplayer *this_local;
  
  bVar4 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->device);
  if (!bVar4) {
    return;
  }
  if (this->disk_pipeline_cache == (VkPipelineCache)0x0) {
    return;
  }
  uVar6 = std::__cxx11::string::empty();
  p_Var3 = vkGetPipelineCacheData;
  if ((uVar6 & 1) != 0) goto LAB_0014118f;
  pipeline_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar7 = std::unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>::
           operator->(&this->device);
  pVVar8 = Fossilize::VulkanDevice::get_device(pVVar7);
  VVar5 = (*p_Var3)(pVVar8,this->disk_pipeline_cache,
                    (size_t *)
                    &pipeline_buffer.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,(void *)0x0);
  __n = pipeline_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  if (VVar5 != VK_SUCCESS) goto LAB_0014118f;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&file + 7));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,(size_type)__n,
             (allocator_type *)((long)&file + 7));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&file + 7));
  p_Var3 = vkGetPipelineCacheData;
  pVVar7 = std::unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>::
           operator->(&this->device);
  pVVar8 = Fossilize::VulkanDevice::get_device(pVVar7);
  pVVar1 = this->disk_pipeline_cache;
  puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  VVar5 = (*p_Var3)(pVVar8,pVVar1,
                    (size_t *)
                    &pipeline_buffer.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,puVar9);
  if (VVar5 == VK_SUCCESS) {
    __filename = (char *)std::__cxx11::string::c_str();
    __s = fopen(__filename,"wb");
    if (__s == (FILE *)0x0) {
LAB_00141145:
      fprintf(_stderr,"Fossilize ERROR: Failed to write pipeline cache data to disk.\n");
      fflush(_stderr);
    }
    else {
      puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
      sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
      sVar11 = fwrite(puVar9,1,sVar10,__s);
      sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
      if (sVar11 != sVar10) goto LAB_00141145;
    }
    if (__s != (FILE *)0x0) {
      fclose(__s);
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
LAB_0014118f:
  p_Var2 = vkDestroyPipelineCache;
  pVVar7 = std::unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>::
           operator->(&this->device);
  pVVar8 = Fossilize::VulkanDevice::get_device(pVVar7);
  (*p_Var2)(pVVar8,this->disk_pipeline_cache,(VkAllocationCallbacks *)0x0);
  this->disk_pipeline_cache = (VkPipelineCache)0x0;
  return;
}

Assistant:

void flush_pipeline_cache()
	{
		if (device && disk_pipeline_cache)
		{
			if (!opts.on_disk_pipeline_cache_path.empty())
			{
				size_t pipeline_cache_size = 0;
				if (vkGetPipelineCacheData(device->get_device(), disk_pipeline_cache, &pipeline_cache_size, nullptr) == VK_SUCCESS)
				{
					vector<uint8_t> pipeline_buffer(pipeline_cache_size);
					if (vkGetPipelineCacheData(device->get_device(), disk_pipeline_cache, &pipeline_cache_size, pipeline_buffer.data()) == VK_SUCCESS)
					{
						// This isn't safe to do in a signal handler, but it's unlikely to be a problem in practice.
						FILE *file = fopen(opts.on_disk_pipeline_cache_path.c_str(), "wb");
						if (!file || fwrite(pipeline_buffer.data(), 1, pipeline_buffer.size(), file) != pipeline_buffer.size())
							LOGE("Failed to write pipeline cache data to disk.\n");
						if (file)
							fclose(file);
					}
				}
			}
			vkDestroyPipelineCache(device->get_device(), disk_pipeline_cache, nullptr);
			disk_pipeline_cache = VK_NULL_HANDLE;
		}
	}